

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O1

int __thiscall DiskWriterIO::OPLinit(DiskWriterIO *this,uint numchips,bool param_2,bool initopl3)

{
  char *pcVar1;
  int iVar2;
  FILE *__s;
  OPL_DOSBOXdump *this_00;
  ulong uVar3;
  uint uVar4;
  
  __s = fopen((this->Filename).Chars,"wb");
  if (__s != (FILE *)0x0) {
    uVar4 = 2 - (numchips < 2);
    (this->super_OPLio).chips[6] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[7] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[4] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[5] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[2] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[3] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[0] = (OPLEmul *)0x0;
    (this->super_OPLio).chips[1] = (OPLEmul *)0x0;
    pcVar1 = (this->Filename).Chars;
    uVar3 = (ulong)*(uint *)(pcVar1 + -0xc);
    if ((uVar3 < 5) || (iVar2 = strcasecmp(pcVar1 + (uVar3 - 4),".dro"), iVar2 != 0)) {
      this_00 = (OPL_DOSBOXdump *)operator_new(0x30);
      (this_00->super_OPLDump).File = (FILE *)__s;
      (this_00->super_OPLDump).TimePerTick = 0.0;
      (this_00->super_OPLDump).CurTime = 0.0;
      (this_00->super_OPLDump).CurIntTime = 0;
      (this_00->super_OPLDump).TickMul = 1;
      (this_00->super_OPLDump).CurChip = '\0';
      (this_00->super_OPLDump).super_OPLEmul._vptr_OPLEmul =
           (_func_int **)&PTR__OPL_RDOSdump_006f38c0;
      fwrite("RAWADATA",1,10,__s);
      (this_00->super_OPLDump).field_0x29 = 1;
    }
    else {
      this_00 = (OPL_DOSBOXdump *)operator_new(0x30);
      OPL_DOSBOXdump::OPL_DOSBOXdump(this_00,(FILE *)__s,1 < numchips);
    }
    (this->super_OPLio).chips[0] = (OPLEmul *)this_00;
    (this->super_OPLio).IsOPL3 = 1 < numchips;
    (this->super_OPLio).OPLchannels = 9 << (1 < numchips);
    (this->super_OPLio).NumChips = uVar4;
    OPLio::OPLwriteInitState(&this->super_OPLio,initopl3);
    return uVar4;
  }
  Printf("Could not open %s for writing.\n",(this->Filename).Chars);
  return 0;
}

Assistant:

int DiskWriterIO::OPLinit(uint numchips, bool, bool initopl3)
{
	FILE *file = fopen(Filename, "wb");
	if (file == NULL)
	{
		Printf("Could not open %s for writing.\n", Filename.GetChars());
		return 0;
	}

	numchips = clamp(numchips, 1u, 2u);
	memset(chips, 0, sizeof(chips));
	// If the file extension is unknown or not present, the default format
	// is RAW. Otherwise, you can use DRO.
	if (Filename.Len() < 5 || stricmp(&Filename[Filename.Len() - 4], ".dro") != 0)
	{
		chips[0] = new OPL_RDOSdump(file);
	}
	else
	{
		chips[0] = new OPL_DOSBOXdump(file, numchips > 1);
	}
	OPLchannels = OPL2CHANNELS * numchips;
	NumChips = numchips;
	IsOPL3 = numchips > 1;
	OPLwriteInitState(initopl3);
	return numchips;
}